

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  printOpenHeader(this,_name);
  poVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam0000000000187fd0 = 0x2e2e2e2e2e2e2e;
    uRam0000000000187fd7._0_1_ = '.';
    uRam0000000000187fd7._1_1_ = '.';
    uRam0000000000187fd7._2_1_ = '.';
    uRam0000000000187fd7._3_1_ = '.';
    uRam0000000000187fd7._4_1_ = '.';
    uRam0000000000187fd7._5_1_ = '.';
    uRam0000000000187fd7._6_1_ = '.';
    uRam0000000000187fd7._7_1_ = '.';
    DAT_00187fc0 = '.';
    DAT_00187fc0_1._0_1_ = '.';
    DAT_00187fc0_1._1_1_ = '.';
    DAT_00187fc0_1._2_1_ = '.';
    DAT_00187fc0_1._3_1_ = '.';
    DAT_00187fc0_1._4_1_ = '.';
    DAT_00187fc0_1._5_1_ = '.';
    DAT_00187fc0_1._6_1_ = '.';
    uRam0000000000187fc8 = 0x2e2e2e2e2e2e2e;
    DAT_00187fcf = 0x2e;
    DAT_00187fb0 = '.';
    DAT_00187fb0_1._0_1_ = '.';
    DAT_00187fb0_1._1_1_ = '.';
    DAT_00187fb0_1._2_1_ = '.';
    DAT_00187fb0_1._3_1_ = '.';
    DAT_00187fb0_1._4_1_ = '.';
    DAT_00187fb0_1._5_1_ = '.';
    DAT_00187fb0_1._6_1_ = '.';
    uRam0000000000187fb8._0_1_ = '.';
    uRam0000000000187fb8._1_1_ = '.';
    uRam0000000000187fb8._2_1_ = '.';
    uRam0000000000187fb8._3_1_ = '.';
    uRam0000000000187fb8._4_1_ = '.';
    uRam0000000000187fb8._5_1_ = '.';
    uRam0000000000187fb8._6_1_ = '.';
    uRam0000000000187fb8._7_1_ = '.';
    DAT_00187fa0 = '.';
    DAT_00187fa0_1._0_1_ = '.';
    DAT_00187fa0_1._1_1_ = '.';
    DAT_00187fa0_1._2_1_ = '.';
    DAT_00187fa0_1._3_1_ = '.';
    DAT_00187fa0_1._4_1_ = '.';
    DAT_00187fa0_1._5_1_ = '.';
    DAT_00187fa0_1._6_1_ = '.';
    uRam0000000000187fa8._0_1_ = '.';
    uRam0000000000187fa8._1_1_ = '.';
    uRam0000000000187fa8._2_1_ = '.';
    uRam0000000000187fa8._3_1_ = '.';
    uRam0000000000187fa8._4_1_ = '.';
    uRam0000000000187fa8._5_1_ = '.';
    uRam0000000000187fa8._6_1_ = '.';
    uRam0000000000187fa8._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam0000000000187f98._0_1_ = '.';
    uRam0000000000187f98._1_1_ = '.';
    uRam0000000000187f98._2_1_ = '.';
    uRam0000000000187f98._3_1_ = '.';
    uRam0000000000187f98._4_1_ = '.';
    uRam0000000000187f98._5_1_ = '.';
    uRam0000000000187f98._6_1_ = '.';
    uRam0000000000187f98._7_1_ = '.';
    DAT_00187fdf = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)46>()::line,sVar2)
  ;
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}